

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

size_t Catch::listTestsNamesOnly(Config *config)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TestSpecParser *this;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *testCases;
  ostream *poVar2;
  size_t sVar3;
  pointer pTVar4;
  allocator local_101;
  TestSpec testSpec;
  string local_e8;
  TestSpec local_c8;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> matchedTestCases;
  
  iVar1 = (*(config->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.super_NonCopyable
            ._vptr_NonCopyable[0xd])();
  std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::vector
            (&testSpec.m_filters,
             (vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
             CONCAT44(extraout_var,iVar1));
  iVar1 = (*(config->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.super_NonCopyable
            ._vptr_NonCopyable[0xd])(config);
  if (*(long *)CONCAT44(extraout_var_00,iVar1) == ((long *)CONCAT44(extraout_var_00,iVar1))[1]) {
    ITagAliasRegistry::get();
    std::__cxx11::string::string((string *)&local_e8,"*",&local_101);
    this = TestSpecParser::parse((TestSpecParser *)&matchedTestCases,&local_e8);
    TestSpecParser::testSpec(&local_c8,this);
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::_M_move_assign
              (&testSpec.m_filters,&local_c8);
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
              (&local_c8.m_filters);
    std::__cxx11::string::~string((string *)&local_e8);
    TestSpecParser::~TestSpecParser((TestSpecParser *)&matchedTestCases);
  }
  testCases = getAllTestCasesSorted((IConfig *)config);
  filterTests(&matchedTestCases,testCases,&testSpec,(IConfig *)config);
  sVar3 = 0;
  for (pTVar4 = matchedTestCases.
                super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
                super__Vector_impl_data._M_start;
      pTVar4 != matchedTestCases.
                super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
                super__Vector_impl_data._M_finish; pTVar4 = pTVar4 + 1) {
    if (((pTVar4->super_TestCaseInfo).name._M_string_length == 0) ||
       (*(pTVar4->super_TestCaseInfo).name._M_dataplus._M_p != '#')) {
      poVar2 = std::operator<<((ostream *)&std::cout,(string *)pTVar4);
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cout,'\"');
      poVar2 = std::operator<<(poVar2,(string *)pTVar4);
      poVar2 = std::operator<<(poVar2,'\"');
    }
    std::endl<char,std::char_traits<char>>(poVar2);
    sVar3 = sVar3 + 1;
  }
  std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::~vector(&matchedTestCases);
  std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
            (&testSpec.m_filters);
  return sVar3;
}

Assistant:

inline std::size_t listTestsNamesOnly( Config const& config ) {
        TestSpec testSpec = config.testSpec();
        if( !config.testSpec().hasFilters() )
            testSpec = TestSpecParser( ITagAliasRegistry::get() ).parse( "*" ).testSpec();
        std::size_t matchedTests = 0;
        std::vector<TestCase> matchedTestCases = filterTests( getAllTestCasesSorted( config ), testSpec, config );
        for( std::vector<TestCase>::const_iterator it = matchedTestCases.begin(), itEnd = matchedTestCases.end();
                it != itEnd;
                ++it ) {
            matchedTests++;
            TestCaseInfo const& testCaseInfo = it->getTestCaseInfo();
            if( startsWith( testCaseInfo.name, '#' ) )
               Catch::cout() << '"' << testCaseInfo.name << '"' << std::endl;
            else
               Catch::cout() << testCaseInfo.name << std::endl;
        }
        return matchedTests;
    }